

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

int run_array_container_andnot(run_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  ushort uVar1;
  rle16_t *prVar2;
  ushort *puVar3;
  uint16_t *puVar4;
  uint16_t *puVar5;
  rle16_t *prVar6;
  bool bVar7;
  uint uVar8;
  _Bool _Var9;
  int iVar10;
  uint uVar11;
  undefined8 in_RAX;
  run_container_t *prVar12;
  array_container_t *paVar13;
  bitset_container_t *src_1_00;
  run_container_t *prVar14;
  long lVar15;
  ushort uVar16;
  uint uVar17;
  long lVar18;
  int iVar19;
  int32_t iVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  uint8_t return_type;
  byte local_31;
  
  local_31 = (byte)((ulong)in_RAX >> 0x38);
  lVar15 = cpuid_Extended_Feature_Enumeration_info(7);
  if ((*(uint *)(lVar15 + 4) & 0x20) == 0) {
    iVar10 = src_1->n_runs;
    lVar15 = (long)iVar10;
    if (0 < lVar15) {
      lVar18 = 0;
      do {
        iVar10 = iVar10 + (uint)src_1->runs[lVar18].length;
        lVar18 = lVar18 + 1;
      } while (lVar15 != lVar18);
    }
  }
  else {
    iVar10 = _avx2_run_container_cardinality(src_1);
  }
  if (iVar10 < 0x21) {
    if (src_2->cardinality == 0) {
      prVar12 = run_container_clone(src_1);
      *dst = prVar12;
      uVar11 = 3;
    }
    else {
      prVar12 = run_container_create_given_capacity(src_2->cardinality + iVar10);
      iVar10 = src_1->n_runs;
      bVar7 = 0 < iVar10;
      if (0 < iVar10) {
        prVar2 = src_1->runs;
        uVar11 = (uint)prVar2->value;
        uVar17 = (uint)prVar2->length + (uint)prVar2->value + 1;
        iVar22 = src_2->cardinality;
        if (iVar22 < 1) {
          uVar24 = 0;
        }
        else {
          puVar3 = src_2->array;
          uVar21 = (uint)*puVar3;
          iVar19 = 0;
          uVar24 = 0;
          do {
            uVar16 = (ushort)uVar11;
            uVar8 = uVar11;
            if (uVar21 < uVar17) {
              if (uVar21 < uVar11) {
                iVar19 = iVar19 + 1;
                if (iVar19 < iVar22) {
                  uVar21 = (uint)puVar3[iVar19];
                }
              }
              else {
                if (uVar11 < uVar21) {
                  prVar6 = prVar12->runs;
                  iVar27 = prVar12->n_runs;
                  prVar12->n_runs = iVar27 + 1;
                  prVar6[iVar27].value = uVar16;
                  prVar6[iVar27].length = ~uVar16 + (short)uVar21;
                }
                uVar8 = uVar21 + 1;
                if (uVar17 <= uVar21 + 1) goto LAB_0010c8bf;
              }
            }
            else {
              prVar6 = prVar12->runs;
              iVar27 = prVar12->n_runs;
              prVar12->n_runs = iVar27 + 1;
              prVar6[iVar27].value = uVar16;
              prVar6[iVar27].length = ~uVar16 + (short)uVar17;
LAB_0010c8bf:
              uVar24 = uVar24 + 1;
              uVar8 = uVar11;
              if ((int)uVar24 < iVar10) {
                uVar17 = (uint)prVar2[(int)uVar24].length + (uint)prVar2[(int)uVar24].value + 1;
                uVar8 = (uint)prVar2[(int)uVar24].value;
              }
            }
            uVar11 = uVar8;
            bVar7 = (int)uVar24 < iVar10;
            if (iVar10 <= (int)uVar24) goto LAB_0010cb71;
          } while (iVar19 < iVar22);
        }
        if (bVar7) {
          prVar6 = prVar12->runs;
          lVar15 = (long)prVar12->n_runs;
          prVar12->n_runs = (int32_t)(lVar15 + 1);
          prVar6[lVar15].value = (ushort)uVar11;
          prVar6[lVar15].length = (short)uVar17 + ~(ushort)uVar11;
          iVar22 = uVar24 + 1;
          if (iVar10 - iVar22 != 0 && iVar22 <= iVar10) {
            memcpy(prVar6 + lVar15 + 1,prVar2 + iVar22,(long)(iVar10 - iVar22) << 2);
            prVar12->n_runs = prVar12->n_runs + ~uVar24 + src_1->n_runs;
          }
        }
      }
LAB_0010cb71:
      prVar14 = (run_container_t *)convert_run_to_efficient_container(prVar12,&local_31);
      *dst = prVar14;
      if (prVar12 != prVar14) {
        run_container_free(prVar12);
      }
      uVar11 = (uint)local_31;
    }
  }
  else if (iVar10 < 0x1001) {
    paVar13 = array_container_create_given_capacity(iVar10);
    iVar10 = src_1->n_runs;
    if ((long)iVar10 < 1) {
      iVar20 = 0;
    }
    else {
      prVar2 = src_1->runs;
      puVar4 = src_2->array;
      iVar19 = src_2->cardinality;
      iVar22 = -1;
      lVar15 = 0;
      iVar20 = 0;
      do {
        uVar16 = prVar2[lVar15].value;
        uVar11 = (uint)uVar16;
        iVar25 = iVar22 + 1;
        iVar27 = iVar25;
        if ((iVar25 < iVar19) && (puVar4[iVar25] < uVar16)) {
          iVar22 = iVar22 + 2;
          iVar26 = 0;
          iVar23 = iVar19 + -1;
          if (iVar22 < iVar19) {
            iVar27 = 1;
            do {
              iVar23 = iVar22;
              iVar26 = iVar27;
              if (uVar16 <= puVar4[iVar22]) break;
              iVar26 = iVar27 * 2;
              iVar22 = iVar25 + iVar27 * 2;
              iVar23 = iVar19 + -1;
              iVar27 = iVar26;
            } while (iVar22 < iVar19);
            iVar26 = iVar26 >> 1;
          }
          iVar27 = iVar23;
          if (((puVar4[iVar23] != uVar16) && (iVar27 = iVar19, uVar16 <= puVar4[iVar23])) &&
             (iVar27 = iVar23, iVar26 + iVar25 + 1 != iVar23)) {
            iVar26 = iVar26 + iVar25;
            do {
              iVar27 = iVar26 + iVar23 >> 1;
              if (puVar4[iVar27] == uVar16) break;
              iVar22 = iVar27;
              if (puVar4[iVar27] < uVar16) {
                iVar22 = iVar23;
                iVar26 = iVar27;
              }
              iVar27 = iVar22;
              iVar23 = iVar22;
            } while (iVar26 + 1 != iVar22);
          }
        }
        iVar22 = iVar27;
        uVar1 = prVar2[lVar15].length;
        if (iVar22 < iVar19) {
          uVar17 = (uint)puVar4[iVar22];
          if ((uint)uVar1 + (uint)uVar16 < (uint)puVar4[iVar22]) {
            puVar5 = paVar13->array;
            lVar18 = 0;
            do {
              puVar5[iVar20 + lVar18] = uVar16 + (short)lVar18;
              lVar18 = lVar18 + 1;
            } while (uVar1 + 1 != (int)lVar18);
            iVar20 = iVar20 + (int)lVar18;
          }
          else {
            iVar27 = uVar1 + 1;
            do {
              if (uVar11 == uVar17) {
                iVar25 = iVar22 + 1;
                if (iVar25 < iVar19) {
                  uVar17 = (uint)puVar4[iVar25];
                  iVar22 = iVar25;
                }
                else {
                  uVar17 = 0;
                }
              }
              else {
                lVar18 = (long)iVar20;
                iVar20 = iVar20 + 1;
                paVar13->array[lVar18] = (uint16_t)uVar11;
              }
              uVar11 = uVar11 + 1;
              iVar27 = iVar27 + -1;
            } while (iVar27 != 0);
          }
          iVar22 = iVar22 + -1;
        }
        else {
          puVar5 = paVar13->array;
          lVar18 = 0;
          do {
            puVar5[iVar20 + lVar18] = uVar16 + (short)lVar18;
            lVar18 = lVar18 + 1;
          } while (uVar1 + 1 != (int)lVar18);
          iVar20 = iVar20 + (int)lVar18;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != iVar10);
    }
    paVar13->cardinality = iVar20;
    *dst = paVar13;
    uVar11 = 2;
  }
  else {
    src_1_00 = bitset_container_from_run(src_1);
    _Var9 = bitset_array_container_iandnot(src_1_00,src_2,dst);
    uVar11 = 2 - _Var9;
  }
  return uVar11;
}

Assistant:

int run_array_container_andnot(
    const run_container_t *src_1, const array_container_t *src_2,
    container_t **dst
){
    // follows the Java impl as of June 2016

    int card = run_container_cardinality(src_1);
    const int arbitrary_threshold = 32;

    if (card <= arbitrary_threshold) {
        if (src_2->cardinality == 0) {
            *dst = run_container_clone(src_1);
            return RUN_CONTAINER_TYPE;
        }
        // Java's "lazyandNot.toEfficientContainer" thing
        run_container_t *answer = run_container_create_given_capacity(
            card + array_container_cardinality(src_2));

        int rlepos = 0;
        int xrlepos = 0;  // "x" is src_2
        rle16_t rle = src_1->runs[rlepos];
        int32_t start = rle.value;
        int32_t end = start + rle.length + 1;
        int32_t xstart = src_2->array[xrlepos];

        while ((rlepos < src_1->n_runs) && (xrlepos < src_2->cardinality)) {
            if (end <= xstart) {
                // output the first run
                answer->runs[answer->n_runs++] =
                    MAKE_RLE16(start, end - start - 1);
                rlepos++;
                if (rlepos < src_1->n_runs) {
                    start = src_1->runs[rlepos].value;
                    end = start + src_1->runs[rlepos].length + 1;
                }
            } else if (xstart + 1 <= start) {
                // exit the second run
                xrlepos++;
                if (xrlepos < src_2->cardinality) {
                    xstart = src_2->array[xrlepos];
                }
            } else {
                if (start < xstart) {
                    answer->runs[answer->n_runs++] =
                        MAKE_RLE16(start, xstart - start - 1);
                }
                if (xstart + 1 < end) {
                    start = xstart + 1;
                } else {
                    rlepos++;
                    if (rlepos < src_1->n_runs) {
                        start = src_1->runs[rlepos].value;
                        end = start + src_1->runs[rlepos].length + 1;
                    }
                }
            }
        }
        if (rlepos < src_1->n_runs) {
            answer->runs[answer->n_runs++] = MAKE_RLE16(start, end - start - 1);
            rlepos++;
            if (rlepos < src_1->n_runs) {
                memcpy(answer->runs + answer->n_runs, src_1->runs + rlepos,
                       (src_1->n_runs - rlepos) * sizeof(rle16_t));
                answer->n_runs += (src_1->n_runs - rlepos);
            }
        }
        uint8_t return_type;
        *dst = convert_run_to_efficient_container(answer, &return_type);
        if (answer != *dst) run_container_free(answer);
        return return_type;
    }
    // else it's a bitmap or array

    if (card <= DEFAULT_MAX_SIZE) {
        array_container_t *ac = array_container_create_given_capacity(card);
        // nb Java code used a generic iterator-based merge to compute
        // difference
        ac->cardinality = run_array_array_subtract(src_1, src_2, ac);
        *dst = ac;
        return ARRAY_CONTAINER_TYPE;
    }
    bitset_container_t *ans = bitset_container_from_run(src_1);
    bool result_is_bitset = bitset_array_container_iandnot(ans, src_2, dst);
    return (result_is_bitset ? BITSET_CONTAINER_TYPE
                             : ARRAY_CONTAINER_TYPE);
}